

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode * pvip_node_alloc(pvip_t *pvip)

{
  int iVar1;
  pvip_arena *ppVar2;
  pvip_arena *arena;
  pvip_t *pvip_local;
  
  if (pvip->arena->idx == 0x400) {
    ppVar2 = (pvip_arena *)malloc(0x6010);
    if (ppVar2 == (pvip_arena *)0x0) {
      fprintf(_stderr,"[PVIP] Cannot allocate memory");
      abort();
    }
    ppVar2->next = pvip->arena;
    pvip->arena = ppVar2;
  }
  ppVar2 = pvip->arena;
  iVar1 = pvip->arena->idx;
  pvip->arena->idx = iVar1 + 1;
  return ppVar2->nodes + iVar1;
}

Assistant:

PVIPNode* pvip_node_alloc(struct pvip_t* pvip) {
    if (pvip->arena->idx==PVIP_ARENA_SIZE) {
        struct pvip_arena* arena = malloc(sizeof(struct pvip_arena));
        ALLOC_CHECK(arena);
        arena->next = pvip->arena;
        pvip->arena = arena;
    }
    return &(pvip->arena->nodes[pvip->arena->idx++]);
}